

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall wasm::Literal::externalize(Literal *__return_storage_ptr__,Literal *this)

{
  Type *this_00;
  ulong uVar1;
  element_type *peVar2;
  bool bVar3;
  BasicHeapType BVar4;
  Shareability SVar5;
  uint uVar6;
  HeapType type;
  HeapType type_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  uint uVar7;
  initializer_list<wasm::Literal> init;
  Literals local_c8;
  Literal local_90;
  shared_ptr<wasm::GCData> local_78;
  HeapType local_68;
  HeapType heapType;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  shared_ptr<wasm::GCData> local_50;
  shared_ptr<wasm::GCData> local_40;
  undefined1 local_29;
  
  uVar1 = (this->type).id;
  if ((6 < uVar1) && ((uVar1 & 1) == 0)) {
    this_00 = &this->type;
    local_c8.super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)wasm::Type::getHeapType(this_00);
    BVar4 = HeapType::getUnsharedTop((HeapType *)&local_c8);
    if (BVar4 == any) {
      local_c8.super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)wasm::Type::getHeapType(this_00);
      SVar5 = HeapType::getShared((HeapType *)&local_c8);
      bVar3 = wasm::Type::isNull(this_00);
      if (bVar3) {
        local_78.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_78.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        Literal(__return_storage_ptr__,&local_78,(HeapType)((ulong)(SVar5 == Shared) * 4 + 0x60));
        this_01._M_pi =
             local_78.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
      }
      else {
        local_68 = wasm::Type::getHeapType(this_00);
        uVar7 = (uint)(SVar5 == Shared) * 4 + 8;
        uVar6 = (uint)local_68.id & 0x7b;
        if (uVar6 == 0x30 && local_68.id < 0x7d) {
          Literal(&local_90,this);
          init._M_len = 1;
          init._M_array = &local_90;
          Literals::Literals(&local_c8,init);
          heapType.id = 0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<wasm::GCData,std::allocator<wasm::GCData>,wasm::HeapType&,wasm::Literals>
                    (&local_58,(GCData **)&heapType,(allocator<wasm::GCData> *)&local_29,&local_68,
                     &local_c8);
          type.id._4_4_ = 0;
          type.id._0_4_ = uVar7;
          Literal(__return_storage_ptr__,(shared_ptr<wasm::GCData> *)&heapType,type);
          if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
          }
          std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                    (&local_c8.super_SmallVector<wasm::Literal,_1UL>.flexible);
          ~Literal(local_c8.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
          ~Literal(&local_90);
          return __return_storage_ptr__;
        }
        peVar2 = (element_type *)(this->field_0).i64;
        if (uVar6 == 0x20 && local_68.id < 0x7d) {
          local_50.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (this->field_0).gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if (local_50.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_50.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_use_count =
                   (local_50.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_50.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_use_count =
                   (local_50.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          local_50.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
          Literal(__return_storage_ptr__,&local_50,(HeapType)((ulong)(SVar5 == Shared) * 4 + 0x50));
          this_01._M_pi =
               local_50.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
        }
        else {
          local_40.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (this->field_0).gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if (local_40.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_40.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_use_count =
                   (local_40.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_40.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_use_count =
                   (local_40.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          type_00.id._4_4_ = 0;
          type_00.id._0_4_ = uVar7;
          local_40.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
          Literal(__return_storage_ptr__,&local_40,type_00);
          this_01._M_pi =
               local_40.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
        }
      }
      if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
      }
      return __return_storage_ptr__;
    }
  }
  __assert_fail("type.isRef() && type.getHeapType().getUnsharedTop() == HeapType::any && \"can only externalize internal references\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                ,0xb44,"Literal wasm::Literal::externalize() const");
}

Assistant:

Literal Literal::externalize() const {
  assert(type.isRef() && type.getHeapType().getUnsharedTop() == HeapType::any &&
         "can only externalize internal references");
  auto share = type.getHeapType().getShared();
  if (isNull()) {
    return Literal(std::shared_ptr<GCData>{}, HeapTypes::noext.getBasic(share));
  }
  auto heapType = type.getHeapType();
  auto extType = HeapTypes::ext.getBasic(share);
  if (heapType.isMaybeShared(HeapType::i31)) {
    return Literal(std::make_shared<GCData>(heapType, Literals{*this}),
                   extType);
  }
  if (heapType.isMaybeShared(HeapType::any)) {
    // Anyref literals turn into strings (if we add any other anyref literals,
    // we will need to be more careful here).
    return Literal(gcData, HeapTypes::string.getBasic(share));
  }
  return Literal(gcData, extType);
}